

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

iterator __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::Descriptor::WellKnownType>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::Descriptor::WellKnownType>>>
::find_non_soo<std::__cxx11::string>
          (raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::Descriptor::WellKnownType>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::Descriptor::WellKnownType>>>
           *this,key_arg<std::__cxx11::basic_string<char>_> *key,size_t hash)

{
  char *pcVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  bool bVar5;
  ushort uVar6;
  ulong uVar7;
  ulong uVar8;
  ctrl_t *unaff_R13;
  uint uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  iterator iVar12;
  __m128i match;
  ulong local_a8;
  anon_union_8_1_a8a14541_for_iterator_2 local_88;
  EqualElement<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  pair<std::tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_std::tuple<const_google::protobuf::Descriptor::WellKnownType_&>_>
  local_68;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  char local_48;
  char cStack_47;
  char cStack_46;
  char cStack_45;
  char cStack_44;
  char cStack_43;
  char cStack_42;
  char cStack_41;
  char cStack_40;
  char cStack_3f;
  char cStack_3e;
  char cStack_3d;
  char cStack_3c;
  char cStack_3b;
  char cStack_3a;
  char cStack_39;
  
  uVar2 = *(ulong *)this;
  if ((uVar2 + 1 & uVar2) != 0) {
    __assert_fail("(((mask + 1) & mask) == 0 && \"not a mask\") && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x14c,
                  "absl::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]")
    ;
  }
  uVar3 = *(ulong *)(this + 0x10);
  local_a8 = (hash >> 7 ^ uVar3 >> 0xc) & uVar2;
  auVar10 = ZEXT216(CONCAT11((char)hash,(char)hash) & 0x7f7f);
  auVar10 = pshuflw(auVar10,auVar10,0);
  local_58 = auVar10._0_4_;
  uVar7 = 0;
  uStack_54 = local_58;
  uStack_50 = local_58;
  uStack_4c = local_58;
  do {
    pcVar1 = (char *)(uVar3 + local_a8);
    local_48 = *pcVar1;
    cStack_47 = pcVar1[1];
    cStack_46 = pcVar1[2];
    cStack_45 = pcVar1[3];
    cStack_44 = pcVar1[4];
    cStack_43 = pcVar1[5];
    cStack_42 = pcVar1[6];
    cStack_41 = pcVar1[7];
    cStack_40 = pcVar1[8];
    cStack_3f = pcVar1[9];
    cStack_3e = pcVar1[10];
    cStack_3d = pcVar1[0xb];
    cStack_3c = pcVar1[0xc];
    cStack_3b = pcVar1[0xd];
    cStack_3a = pcVar1[0xe];
    cStack_39 = pcVar1[0xf];
    auVar10[0] = -((char)local_58 == local_48);
    auVar10[1] = -(local_58._1_1_ == cStack_47);
    auVar10[2] = -(local_58._2_1_ == cStack_46);
    auVar10[3] = -(local_58._3_1_ == cStack_45);
    auVar10[4] = -((char)uStack_54 == cStack_44);
    auVar10[5] = -(uStack_54._1_1_ == cStack_43);
    auVar10[6] = -(uStack_54._2_1_ == cStack_42);
    auVar10[7] = -(uStack_54._3_1_ == cStack_41);
    auVar10[8] = -((char)uStack_50 == cStack_40);
    auVar10[9] = -(uStack_50._1_1_ == cStack_3f);
    auVar10[10] = -(uStack_50._2_1_ == cStack_3e);
    auVar10[0xb] = -(uStack_50._3_1_ == cStack_3d);
    auVar10[0xc] = -((char)uStack_4c == cStack_3c);
    auVar10[0xd] = -(uStack_4c._1_1_ == cStack_3b);
    auVar10[0xe] = -(uStack_4c._2_1_ == cStack_3a);
    auVar10[0xf] = -(uStack_4c._3_1_ == cStack_39);
    uVar6 = (ushort)(SUB161(auVar10 >> 7,0) & 1) | (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe | (ushort)(auVar10[0xf] >> 7) << 0xf;
    uVar9 = (uint)uVar6;
    while (uVar6 != 0) {
      uVar4 = 0;
      if (uVar9 != 0) {
        for (; (uVar9 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
        }
      }
      uVar8 = uVar4 + local_a8 & uVar2;
      local_68.first.
      super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
      .
      super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_false>
      ._M_head_impl =
           (_Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
            )(*(long *)(this + 0x18) + uVar8 * 0x28);
      local_68.second.super__Tuple_impl<0UL,_const_google::protobuf::Descriptor::WellKnownType_&>.
      super__Head_base<0UL,_const_google::protobuf::Descriptor::WellKnownType_&,_false>._M_head_impl
           = (_Tuple_impl<0UL,_const_google::protobuf::Descriptor::WellKnownType_&>)
             (*(long *)(this + 0x18) + uVar8 * 0x28 + 0x20);
      local_78.rhs = key;
      local_78.eq = (key_equal *)this;
      bVar5 = memory_internal::
              DecomposePairImpl<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::Descriptor::WellKnownType>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::Descriptor::WellKnownType>>>::EqualElement<std::__cxx11::string>,std::__cxx11::string_const&,std::tuple<google::protobuf::Descriptor::WellKnownType_const&>>
                        (&local_78,&local_68);
      if (bVar5) {
        if (*(long *)(this + 0x10) == 0) {
          __assert_fail("ctrl != nullptr",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x9ef,
                        "absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, google::protobuf::Descriptor::WellKnownType>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::pair<const std::basic_string<char>, google::protobuf::Descriptor::WellKnownType>>>::iterator::iterator(ctrl_t *, slot_type *, const GenerationType *) [Policy = absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, google::protobuf::Descriptor::WellKnownType>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::pair<const std::basic_string<char>, google::protobuf::Descriptor::WellKnownType>>]"
                       );
        }
        unaff_R13 = (ctrl_t *)(*(long *)(this + 0x10) + uVar8);
        local_88.slot_ = (slot_type *)(uVar8 * 0x28 + *(long *)(this + 0x18));
      }
      if (bVar5) break;
      uVar6 = (ushort)(uVar9 - 1) & (ushort)uVar9;
      uVar9 = CONCAT22((short)(uVar9 - 1 >> 0x10),uVar6);
    }
    if (uVar6 != 0) {
LAB_001f4359:
      bVar5 = false;
      uVar8 = uVar7;
    }
    else {
      auVar11[0] = -(local_48 == -0x80);
      auVar11[1] = -(cStack_47 == -0x80);
      auVar11[2] = -(cStack_46 == -0x80);
      auVar11[3] = -(cStack_45 == -0x80);
      auVar11[4] = -(cStack_44 == -0x80);
      auVar11[5] = -(cStack_43 == -0x80);
      auVar11[6] = -(cStack_42 == -0x80);
      auVar11[7] = -(cStack_41 == -0x80);
      auVar11[8] = -(cStack_40 == -0x80);
      auVar11[9] = -(cStack_3f == -0x80);
      auVar11[10] = -(cStack_3e == -0x80);
      auVar11[0xb] = -(cStack_3d == -0x80);
      auVar11[0xc] = -(cStack_3c == -0x80);
      auVar11[0xd] = -(cStack_3b == -0x80);
      auVar11[0xe] = -(cStack_3a == -0x80);
      auVar11[0xf] = -(cStack_39 == -0x80);
      if ((((((((((((((((auVar11 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar11 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar11 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar11 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar11 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar11 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar11 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar11 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar11 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar11 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar11 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar11 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar11 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar11 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar11 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || cStack_39 == -0x80)
      {
        raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>_>_>
        ::AssertNotDebugCapacity
                  ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>_>_>
                    *)this);
        unaff_R13 = (ctrl_t *)0x0;
        goto LAB_001f4359;
      }
      uVar8 = uVar7 + 0x10;
      if (*(ulong *)this < uVar8) {
        __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xe37,
                      "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, google::protobuf::Descriptor::WellKnownType>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::pair<const std::basic_string<char>, google::protobuf::Descriptor::WellKnownType>>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, google::protobuf::Descriptor::WellKnownType>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::pair<const std::basic_string<char>, google::protobuf::Descriptor::WellKnownType>>, K = std::basic_string<char>]"
                     );
      }
      local_a8 = local_a8 + uVar7 + 0x10 & uVar2;
      bVar5 = true;
    }
    uVar7 = uVar8;
    if (!bVar5) {
      iVar12.field_1 =
           (anon_union_8_1_a8a14541_for_iterator_2)
           (anon_union_8_1_a8a14541_for_iterator_2)local_88.slot_;
      iVar12.ctrl_ = unaff_R13;
      return iVar12;
    }
  } while( true );
}

Assistant:

iterator find_non_soo(const key_arg<K>& key, size_t hash) {
    ABSL_SWISSTABLE_ASSERT(!is_soo());
    auto seq = probe(common(), hash);
    const ctrl_t* ctrl = control();
    while (true) {
      Group g{ctrl + seq.offset()};
      for (uint32_t i : g.Match(H2(hash))) {
        if (ABSL_PREDICT_TRUE(PolicyTraits::apply(
                EqualElement<K>{key, eq_ref()},
                PolicyTraits::element(slot_array() + seq.offset(i)))))
          return iterator_at(seq.offset(i));
      }
      if (ABSL_PREDICT_TRUE(g.MaskEmpty())) return end();
      seq.next();
      ABSL_SWISSTABLE_ASSERT(seq.index() <= capacity() && "full table!");
    }
  }